

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Bool prvTidyIsXMLNamechar(uint c)

{
  Bool BVar1;
  Bool BVar2;
  undefined4 extraout_EDX;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar8;
  undefined1 auVar7 [16];
  ulong uVar9;
  
  BVar1 = prvTidyIsXMLLetter(c);
  BVar2 = yes;
  if (((((BVar1 == no) &&
        ((((uVar3 = extraout_EDX, 0x32 < c - 0x2d ||
           (uVar3 = 0x2003, (0x4000000002003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) == 0)) &&
          (auVar6._0_4_ = -(uint)(-0x7fffffbb < (int)(c - 0x300 ^ 0x80000000)),
          auVar6._4_4_ = -(uint)(-0x7ffffffd < (int)(c - 0x483 ^ 0x80000000)),
          auVar6._8_4_ = -(uint)(-0x7ffffff0 < (int)(c - 0x591 ^ 0x80000000)),
          auVar6._12_4_ = -(uint)(-0x7fffffea < (int)(c - 0x5a3 ^ 0x80000000)),
          iVar4 = movmskps(uVar3,auVar6), iVar4 == 0xf && (c & 0xfffffffe) != 0x360)) &&
         ((0x17 < c - 0x6d6 || ((0xf67fffU >> (c - 0x6d6 & 0x1f) & 1) == 0)))))) &&
       ((0x25 < c - 0x64b || ((0x20000000ffU >> ((ulong)(c - 0x64b) & 0x3f) & 1) == 0)))) &&
      (((9 < c - 0x5bb || ((0x2d7U >> (c - 0x5bb & 0x1f) & 1) == 0)) &&
       ((0x3b < c - 0x901 || ((0x800000000000007U >> ((ulong)(c - 0x901) & 0x3f) & 1) == 0)))))) &&
     (((((0xf < c - 0x93e &&
         (((0x27 < c - 0x9bc || ((0xc0080399fdU >> ((ulong)(c - 0x9bc) & 0x3f) & 1) == 0)) &&
          (((0x11 < c - 0xabc || ((0x3bbfdU >> (c - 0xabc & 0x1f) & 1) == 0)) &&
           ((0x1b < c - 0xb3c || ((0xc0398fdU >> (c - 0xb3c & 0x1f) & 1) == 0)))))))) &&
        ((((0x35 < c - 0xa3c || ((0x3000000003987dU >> ((ulong)(c - 0xa3c) & 0x3f) & 1) == 0)) &&
          ((((0x19 < c - 0xbbe || ((0x200f71fU >> (c - 0xbbe & 0x1f) & 1) == 0)) &&
            ((0x32 < c - 0x951 || ((0x700000006000fU >> ((ulong)(c - 0x951) & 0x3f) & 1) == 0)))) &&
           ((((2 < c - 0xa81 && (2 < c - 0xb01)) && (1 < c - 0xb82)) && (c != 0xa02)))))) &&
         ((0x19 < c - 0xd3e || ((0x200f73fU >> (c - 0xd3e & 0x1f) & 1) == 0)))))) &&
       (((0x3d < c - 0xc46 || ((0x30000000000180f7U >> ((ulong)(c - 0xc46) & 0x3f) & 1) == 0)) &&
        ((((0x3d < c - 0xcc6 || ((0x30000000000180f7U >> ((ulong)(c - 0xcc6) & 0x3f) & 1) == 0)) &&
          (6 < c - 0xc3e)) && (((6 < c - 0xcbe && (2 < c - 0xc01)) && (c != 0xe31)))))))) &&
      ((((6 < c - 0xe34 && ((0x1c < c - 0xeb1 || ((0x1f800df9U >> (c - 0xeb1 & 0x1f) & 1) == 0))))
        && (7 < c - 0xe47)) &&
       (((0x27 < c - 0xf18 || ((0xc2a0000003U >> ((ulong)(c - 0xf18) & 0x3f) & 1) == 0)) &&
        (5 < c - 0xf86 && 0x13 < c - 0xf71)))))))) {
    if (c - 0xf90 < 8) {
      if ((0xbfU >> (c - 0xf90 & 0x1f) & 1) != 0) {
        return yes;
      }
    }
    else if (c - 0xf99 < 0x15) {
      return yes;
    }
    if ((((8 < c - 0xfb1) || ((0x17fU >> (c - 0xfb1 & 0x1f) & 1) == 0)) &&
        (c != 0x20e1 && 0xc < c - 0x20d0)) && ((5 < c - 0x302a && (1 < c - 0x3099)))) {
      uVar9 = CONCAT44(c,c) & 0xffffff7effffffff;
      iVar4 = (int)uVar9;
      iVar8 = (int)(uVar9 >> 0x20);
      auVar7._0_4_ = -(uint)(-0x7ffffff7 < (int)((c & 0xffffff7e) - 0xa66 ^ 0x80000000));
      auVar7._4_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0xb66 ^ 0x80000000));
      auVar7._8_4_ = -(uint)(-0x7ffffff8 < (int)(iVar4 - 0xbe7U ^ 0x80000000));
      auVar7._12_4_ = -(uint)(-0x7ffffff7 < (int)(iVar8 - 0xc66U ^ 0x80000000));
      auVar5._0_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x30 ^ 0x80000000));
      auVar5._4_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x660 ^ 0x80000000));
      auVar5._8_4_ = -(uint)(-0x7ffffff7 < (int)(iVar4 - 0x6f0U ^ 0x80000000));
      auVar5._12_4_ = -(uint)(-0x7ffffff7 < (int)(iVar8 - 0x966U ^ 0x80000000));
      auVar6 = packssdw(auVar5,auVar7);
      auVar6 = packsswb(auVar6,auVar6);
      if (((((((byte)(SUB161(auVar6 >> 7,0) & 1 | (SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (SUB161(auVar6 >> 0x17,0) & 1) << 2 | (SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                      (SUB161(auVar6 >> 0x27,0) & 1) << 4 | (SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                      (SUB161(auVar6 >> 0x37,0) & 1) << 6 | SUB161(auVar6 >> 0x3f,0) << 7) == 0xff)
             && ((9 < c - 0xd66 && (9 < (c & 0xffffff7e) - 0xe50)))) && (9 < c - 0xf20)) &&
           (((0x30 < c - 0x3005 || ((0x1f00000000001U >> ((ulong)(c - 0x3005) & 0x3f) & 1) == 0)) &&
            (1 < c - 0x2d0)))) &&
          (((1 < c - 0x309d && (c != 0xb7)) && ((c != 0x387 && ((c != 0x640 && (c != 0xe46))))))))
         && (c != 0xec6)) {
        BVar2 = (Bool)(c - 0x30fc < 3);
      }
    }
  }
  return BVar2;
}

Assistant:

Bool TY_(IsXMLNamechar)(uint c)
{
    return (TY_(IsXMLLetter)(c) ||
        c == '.' || c == '_' ||
        c == ':' || c == '-' ||
        (c >= 0x300 && c <= 0x345) ||
        (c >= 0x360 && c <= 0x361) ||
        (c >= 0x483 && c <= 0x486) ||
        (c >= 0x591 && c <= 0x5a1) ||
        (c >= 0x5a3 && c <= 0x5b9) ||
        (c >= 0x5bb && c <= 0x5bd) ||
        c == 0x5bf ||
        (c >= 0x5c1 && c <= 0x5c2) ||
        c == 0x5c4 ||
        (c >= 0x64b && c <= 0x652) ||
        c == 0x670 ||
        (c >= 0x6d6 && c <= 0x6dc) ||
        (c >= 0x6dd && c <= 0x6df) ||
        (c >= 0x6e0 && c <= 0x6e4) ||
        (c >= 0x6e7 && c <= 0x6e8) ||
        (c >= 0x6ea && c <= 0x6ed) ||
        (c >= 0x901 && c <= 0x903) ||
        c == 0x93c ||
        (c >= 0x93e && c <= 0x94c) ||
        c == 0x94d ||
        (c >= 0x951 && c <= 0x954) ||
        (c >= 0x962 && c <= 0x963) ||
        (c >= 0x981 && c <= 0x983) ||
        c == 0x9bc ||
        c == 0x9be ||
        c == 0x9bf ||
        (c >= 0x9c0 && c <= 0x9c4) ||
        (c >= 0x9c7 && c <= 0x9c8) ||
        (c >= 0x9cb && c <= 0x9cd) ||
        c == 0x9d7 ||
        (c >= 0x9e2 && c <= 0x9e3) ||
        c == 0xa02 ||
        c == 0xa3c ||
        c == 0xa3e ||
        c == 0xa3f ||
        (c >= 0xa40 && c <= 0xa42) ||
        (c >= 0xa47 && c <= 0xa48) ||
        (c >= 0xa4b && c <= 0xa4d) ||
        (c >= 0xa70 && c <= 0xa71) ||
        (c >= 0xa81 && c <= 0xa83) ||
        c == 0xabc ||
        (c >= 0xabe && c <= 0xac5) ||
        (c >= 0xac7 && c <= 0xac9) ||
        (c >= 0xacb && c <= 0xacd) ||
        (c >= 0xb01 && c <= 0xb03) ||
        c == 0xb3c ||
        (c >= 0xb3e && c <= 0xb43) ||
        (c >= 0xb47 && c <= 0xb48) ||
        (c >= 0xb4b && c <= 0xb4d) ||
        (c >= 0xb56 && c <= 0xb57) ||
        (c >= 0xb82 && c <= 0xb83) ||
        (c >= 0xbbe && c <= 0xbc2) ||
        (c >= 0xbc6 && c <= 0xbc8) ||
        (c >= 0xbca && c <= 0xbcd) ||
        c == 0xbd7 ||
        (c >= 0xc01 && c <= 0xc03) ||
        (c >= 0xc3e && c <= 0xc44) ||
        (c >= 0xc46 && c <= 0xc48) ||
        (c >= 0xc4a && c <= 0xc4d) ||
        (c >= 0xc55 && c <= 0xc56) ||
        (c >= 0xc82 && c <= 0xc83) ||
        (c >= 0xcbe && c <= 0xcc4) ||
        (c >= 0xcc6 && c <= 0xcc8) ||
        (c >= 0xcca && c <= 0xccd) ||
        (c >= 0xcd5 && c <= 0xcd6) ||
        (c >= 0xd02 && c <= 0xd03) ||
        (c >= 0xd3e && c <= 0xd43) ||
        (c >= 0xd46 && c <= 0xd48) ||
        (c >= 0xd4a && c <= 0xd4d) ||
        c == 0xd57 ||
        c == 0xe31 ||
        (c >= 0xe34 && c <= 0xe3a) ||
        (c >= 0xe47 && c <= 0xe4e) ||
        c == 0xeb1 ||
        (c >= 0xeb4 && c <= 0xeb9) ||
        (c >= 0xebb && c <= 0xebc) ||
        (c >= 0xec8 && c <= 0xecd) ||
        (c >= 0xf18 && c <= 0xf19) ||
        c == 0xf35 ||
        c == 0xf37 ||
        c == 0xf39 ||
        c == 0xf3e ||
        c == 0xf3f ||
        (c >= 0xf71 && c <= 0xf84) ||
        (c >= 0xf86 && c <= 0xf8b) ||
        (c >= 0xf90 && c <= 0xf95) ||
        c == 0xf97 ||
        (c >= 0xf99 && c <= 0xfad) ||
        (c >= 0xfb1 && c <= 0xfb7) ||
        c == 0xfb9 ||
        (c >= 0x20d0 && c <= 0x20dc) ||
        c == 0x20e1 ||
        (c >= 0x302a && c <= 0x302f) ||
        c == 0x3099 ||
        c == 0x309a ||
        (c >= 0x30 && c <= 0x39) ||
        (c >= 0x660 && c <= 0x669) ||
        (c >= 0x6f0 && c <= 0x6f9) ||
        (c >= 0x966 && c <= 0x96f) ||
        (c >= 0x9e6 && c <= 0x9ef) ||
        (c >= 0xa66 && c <= 0xa6f) ||
        (c >= 0xae6 && c <= 0xaef) ||
        (c >= 0xb66 && c <= 0xb6f) ||
        (c >= 0xbe7 && c <= 0xbef) ||
        (c >= 0xc66 && c <= 0xc6f) ||
        (c >= 0xce6 && c <= 0xcef) ||
        (c >= 0xd66 && c <= 0xd6f) ||
        (c >= 0xe50 && c <= 0xe59) ||
        (c >= 0xed0 && c <= 0xed9) ||
        (c >= 0xf20 && c <= 0xf29) ||
        c == 0xb7 ||
        c == 0x2d0 ||
        c == 0x2d1 ||
        c == 0x387 ||
        c == 0x640 ||
        c == 0xe46 ||
        c == 0xec6 ||
        c == 0x3005 ||
        (c >= 0x3031 && c <= 0x3035) ||
        (c >= 0x309d && c <= 0x309e) ||
        (c >= 0x30fc && c <= 0x30fe));
}